

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::outmetrics(tetgenmesh *this,tetgenio *out)

{
  int iVar1;
  memorypool *pmVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  double *pdVar7;
  void *pvVar8;
  int *piVar9;
  undefined4 *puVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  char outmtrfilename [1024];
  FILE *local_458;
  char local_438 [4];
  undefined1 auStack_434 [1028];
  
  uVar12 = this->sizeoftensor - this->useinsertradius;
  if (uVar12 != 0) {
    if (out == (tetgenio *)0x0) {
      strcpy(local_438,this->b->outfilename);
      sVar6 = strlen(local_438);
      builtin_strncpy(local_438 + sVar6,".mtr",4);
      auStack_434[sVar6] = 0;
    }
    if (this->b->quiet == 0) {
      if (out == (tetgenio *)0x0) {
        printf("Writing %s.\n",local_438);
      }
      else {
        puts("Writing metrics.");
      }
    }
    if (out == (tetgenio *)0x0) {
      local_458 = fopen(local_438,"w");
      if (local_458 == (FILE *)0x0) goto LAB_001554e0;
      fprintf(local_458,"%ld  %d\n",this->points->items,(ulong)uVar12);
    }
    else {
      out->numberofpointmtrs = uVar12;
      uVar11 = (long)(int)uVar12 * this->points->items;
      local_458 = (FILE *)0x0;
      pdVar7 = (double *)operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar11 * 8);
      out->pointmtrlist = pdVar7;
    }
    pmVar2 = this->points;
    ppvVar3 = pmVar2->firstblock;
    pmVar2->pathblock = ppvVar3;
    pmVar2->pathitem =
         (void *)((long)ppvVar3 +
                 (((long)pmVar2->alignbytes + 8U) -
                 (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
    pmVar2->pathitemsleft = pmVar2->itemsperblock;
    do {
      pvVar8 = memorypool::traverse(this->points);
      if (pvVar8 == (void *)0x0) {
        pvVar8 = (void *)0x0;
        break;
      }
    } while ((*(uint *)((long)pvVar8 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
    if (pvVar8 != (void *)0x0) {
      iVar5 = 0;
      do {
        if (out == (tetgenio *)0x0) {
          if (0 < (int)uVar12) {
            lVar13 = 0;
            do {
              fprintf(local_458," %-16.8e",
                      *(undefined8 *)((long)pvVar8 + (this->pointmtrindex + lVar13) * 8));
              lVar13 = lVar13 + 1;
            } while (uVar12 != (uint)lVar13);
          }
          fputc(10,local_458);
        }
        else if (0 < (int)uVar12) {
          iVar1 = this->pointmtrindex;
          pdVar7 = out->pointmtrlist;
          uVar11 = 0;
          do {
            pdVar7[(long)iVar5 + uVar11] = *(double *)((long)pvVar8 + uVar11 * 8 + (long)iVar1 * 8);
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
          iVar5 = iVar5 + (int)uVar11;
        }
        do {
          pvVar8 = memorypool::traverse(this->points);
          if (pvVar8 == (void *)0x0) {
            pvVar8 = (void *)0x0;
            break;
          }
        } while ((*(uint *)((long)pvVar8 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                 0xa00);
      } while (pvVar8 != (void *)0x0);
    }
    if (out == (tetgenio *)0x0) {
      strcpy(local_438,this->b->outfilename);
      sVar6 = strlen(local_438);
      builtin_strncpy(local_438 + sVar6,".p2t",4);
      auStack_434[sVar6] = 0;
    }
    if (this->b->quiet == 0) {
      if (out == (tetgenio *)0x0) {
        printf("Writing %s.\n",local_438);
      }
      else {
        puts("Writing point-to-tet map.");
      }
    }
    if (out == (tetgenio *)0x0) {
      local_458 = fopen(local_438,"w");
      if (local_458 == (FILE *)0x0) {
LAB_001554e0:
        printf("File I/O Error:  Cannot create file %s.\n",local_438);
        puVar10 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar10 = 3;
        __cxa_throw(puVar10,&int::typeinfo,0);
      }
    }
    else {
      uVar11 = this->points->items;
      piVar9 = (int *)operator_new__(-(ulong)(uVar11 >> 0x3e != 0) | uVar11 << 2);
      out->point2tetlist = piVar9;
    }
    if (this->bgm != (tetgenmesh *)0x0) {
      indexelements(this->bgm);
    }
    uVar12 = 0;
    if (this->b->zeroindex == 0) {
      uVar12 = this->in->firstnumber;
    }
    pmVar2 = this->points;
    ppvVar3 = pmVar2->firstblock;
    pmVar2->pathblock = ppvVar3;
    pmVar2->pathitem =
         (void *)((long)ppvVar3 +
                 (((long)pmVar2->alignbytes + 8U) -
                 (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
    pmVar2->pathitemsleft = pmVar2->itemsperblock;
    do {
      pvVar8 = memorypool::traverse(this->points);
      if (pvVar8 == (void *)0x0) {
        pvVar8 = (void *)0x0;
        break;
      }
    } while ((*(uint *)((long)pvVar8 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
    if (pvVar8 != (void *)0x0) {
      lVar13 = 0;
      do {
        lVar4 = (long)this->point2simindex * 8 + 0x18;
        if (this->bgm == (tetgenmesh *)0x0) {
          lVar4 = (long)this->point2simindex * 8;
        }
        if (out == (tetgenio *)0x0) {
          fprintf(local_458,"%d  %d\n",(ulong)uVar12);
        }
        else {
          out->point2tetlist[lVar13] =
               *(int *)((*(ulong *)((long)pvVar8 + lVar4) & 0xfffffffffffffff0) + 0x50);
        }
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 1;
        do {
          pvVar8 = memorypool::traverse(this->points);
          if (pvVar8 == (void *)0x0) {
            pvVar8 = (void *)0x0;
            break;
          }
        } while ((*(uint *)((long)pvVar8 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                 0xa00);
      } while (pvVar8 != (void *)0x0);
    }
    if (out == (tetgenio *)0x0) {
      fprintf(local_458,"# Generated by %s\n",this->b->commandline);
      fclose(local_458);
    }
  }
  return;
}

Assistant:

void tetgenmesh::outmetrics(tetgenio* out)
{
  FILE *outfile = NULL;
  char outmtrfilename[FILENAMESIZE];
  point ptloop;
  int mtrindex = 0;
  int i;
  int msize = (sizeoftensor - useinsertradius);
  if (msize == 0) {
    return;
  }

  if (out == (tetgenio *) NULL) {
    strcpy(outmtrfilename, b->outfilename);
    strcat(outmtrfilename, ".mtr");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outmtrfilename);
    } else {
      printf("Writing metrics.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(outmtrfilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outmtrfilename);
      terminatetetgen(this, 3);
    }
    // Number of points, number of point metrices,
    fprintf(outfile, "%ld  %d\n", points->items, msize);
  } else {
    // Allocate space for 'pointmtrlist'.
    out->numberofpointmtrs = msize; 
    out->pointmtrlist = new REAL[points->items * msize];
    if (out->pointmtrlist == (REAL *) NULL) {
      terminatetetgen(this, 1);
    }
  }

  points->traversalinit();
  ptloop = pointtraverse();
  while (ptloop != (point) NULL) {
    if (out == (tetgenio *) NULL) {
      for (i = 0; i < msize; i++) {
        fprintf(outfile, " %-16.8e", ptloop[pointmtrindex + i]);
      }
      fprintf(outfile, "\n");
    } else {
      for (i = 0; i < msize; i++) {
        out->pointmtrlist[mtrindex++] = ptloop[pointmtrindex + i];
      }
    }
    ptloop = pointtraverse();
  }

  // Output the point-to-tet map.
  if (out == (tetgenio *) NULL) {
    strcpy(outmtrfilename, b->outfilename);
    strcat(outmtrfilename, ".p2t");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outmtrfilename);
    } else {
      printf("Writing point-to-tet map.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(outmtrfilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outmtrfilename);
      terminatetetgen(this, 3);
    }
    // Number of points,
    //fprintf(outfile, "%ld\n", points->items);
  } else {
    // Allocate space for 'point2tetlist'.
    out->point2tetlist = new int[points->items];
    if (out->point2tetlist == (int *) NULL) {
      terminatetetgen(this, 1);
    }
  }

  // The list of tetrahedra must be indexed.
  if (bgm != NULL) {
    bgm->indexelements();
  }
  // Determine the first index (0 or 1).
  int firstindex = b->zeroindex ? 0 : in->firstnumber;
  int pointindex = firstindex;
  i = 0;

  triface parenttet;
  points->traversalinit();
  ptloop = pointtraverse();
  while (ptloop != (point) NULL) {
    if (bgm != NULL) {
	  bgm->decode(point2bgmtet(ptloop), parenttet);
	} else {
	  decode(point2tet(ptloop), parenttet);
	}
    if (out == (tetgenio *) NULL) {
      fprintf(outfile, "%d  %d\n", pointindex, elemindex(parenttet.tet));
    } else {
      out->point2tetlist[i] = elemindex(parenttet.tet);
    }
	pointindex++;
	i++;
    ptloop = pointtraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}